

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRShared.cpp
# Opt level: O3

void __thiscall Assimp::IrrlichtBase::ReadVectorProperty(IrrlichtBase *this,VectorProperty *out)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar3;
  undefined4 extraout_var_02;
  Logger *pLVar4;
  uint uVar5;
  char *pcVar6;
  allocator<char> local_69;
  float *local_68;
  float *local_60;
  aiVector3t<float> *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  iVar2 = (*this->reader->_vptr_IIrrXMLReader[4])();
  if (0 < iVar2) {
    local_58 = &out->value;
    local_60 = &(out->value).y;
    local_68 = &(out->value).z;
    uVar5 = 0;
    do {
      iVar2 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar5);
      if ((char *)CONCAT44(extraout_var,iVar2) == (char *)0x0) {
LAB_0043f67f:
        __assert_fail("__null != s1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                      ,0x8f,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
      }
      iVar2 = strcasecmp((char *)CONCAT44(extraout_var,iVar2),"name");
      if (iVar2 == 0) {
        iVar2 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)uVar5);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_50,(char *)CONCAT44(extraout_var_02,iVar2),&local_69);
        std::__cxx11::string::operator=((string *)out,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      else {
        iVar2 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar5);
        if ((char *)CONCAT44(extraout_var_00,iVar2) == (char *)0x0) goto LAB_0043f67f;
        iVar2 = strcasecmp((char *)CONCAT44(extraout_var_00,iVar2),"value");
        if (iVar2 == 0) {
          iVar2 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)uVar5);
          for (pcVar3 = (char *)CONCAT44(extraout_var_01,iVar2);
              (*pcVar3 == ' ' || (*pcVar3 == '\t')); pcVar3 = pcVar3 + 1) {
          }
          pcVar3 = fast_atoreal_move<float>(pcVar3,&local_58->x,true);
          pcVar6 = pcVar3;
          while( true ) {
            pcVar3 = pcVar3 + 1;
            cVar1 = *pcVar6;
            if ((cVar1 != '\t') && (cVar1 != ' ')) break;
            pcVar6 = pcVar6 + 1;
          }
          if (cVar1 == ',') {
            for (; (*pcVar3 == ' ' || (*pcVar3 == '\t')); pcVar3 = pcVar3 + 1) {
            }
          }
          else {
            pLVar4 = DefaultLogger::get();
            Logger::error(pLVar4,"IRR(MESH): Expected comma in vector definition");
            pcVar3 = pcVar6;
          }
          pcVar3 = fast_atoreal_move<float>(pcVar3,local_60,true);
          pcVar6 = pcVar3;
          while( true ) {
            pcVar3 = pcVar3 + 1;
            cVar1 = *pcVar6;
            if ((cVar1 != '\t') && (cVar1 != ' ')) break;
            pcVar6 = pcVar6 + 1;
          }
          if (cVar1 == ',') {
            for (; (*pcVar3 == ' ' || (*pcVar3 == '\t')); pcVar3 = pcVar3 + 1) {
            }
          }
          else {
            pLVar4 = DefaultLogger::get();
            Logger::error(pLVar4,"IRR(MESH): Expected comma in vector definition");
            pcVar3 = pcVar6;
          }
          fast_atoreal_move<float>(pcVar3,local_68,true);
        }
      }
      uVar5 = uVar5 + 1;
      iVar2 = (*this->reader->_vptr_IIrrXMLReader[4])();
    } while ((int)uVar5 < iVar2);
  }
  return;
}

Assistant:

void IrrlichtBase::ReadVectorProperty  (VectorProperty&  out)
{
    for (int i = 0; i < reader->getAttributeCount();++i)
    {
        if (!ASSIMP_stricmp(reader->getAttributeName(i),"name"))
        {
            out.name = std::string( reader->getAttributeValue(i) );
        }
        else if (!ASSIMP_stricmp(reader->getAttributeName(i),"value"))
        {
            // three floats, separated with commas
            const char* ptr = reader->getAttributeValue(i);

            SkipSpaces(&ptr);
            ptr = fast_atoreal_move<float>( ptr,(float&)out.value.x );
            SkipSpaces(&ptr);
            if (',' != *ptr)
            {
                ASSIMP_LOG_ERROR("IRR(MESH): Expected comma in vector definition");
            }
            else SkipSpaces(ptr+1,&ptr);
            ptr = fast_atoreal_move<float>( ptr,(float&)out.value.y );
            SkipSpaces(&ptr);
            if (',' != *ptr)
            {
                ASSIMP_LOG_ERROR("IRR(MESH): Expected comma in vector definition");
            }
            else SkipSpaces(ptr+1,&ptr);
            ptr = fast_atoreal_move<float>( ptr,(float&)out.value.z );
        }
    }
}